

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall kratos::FSM::output_table(FSM *this,string *filename)

{
  undefined1 local_230 [8];
  ofstream stream;
  ios_base local_138 [264];
  string local_30;
  
  std::ofstream::ofstream(local_230,(string *)filename,_S_out);
  output_table_abi_cxx11_(&local_30,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&stream);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FSM::output_table(const std::string& filename) {
    std::ofstream stream(filename);
    stream << output_table();
    stream.close();
}